

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

bool __thiscall
cmCTestVC::RunUpdateCommand
          (cmCTestVC *this,char **cmd,OutputParser *out,OutputParser *err,Encoding encoding)

{
  bool bVar1;
  ostream *poVar2;
  string local_50;
  
  ComputeCommandLine_abi_cxx11_(&local_50,(cmCTestVC *)cmd,(char **)out);
  std::__cxx11::string::operator=((string *)&this->UpdateCommandLine,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (bVar1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->Log,(this->UpdateCommandLine)._M_dataplus._M_p,
                        (this->UpdateCommandLine)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    bVar1 = true;
  }
  else {
    bVar1 = RunChild(this,cmd,out,err,(char *)0x0,encoding);
  }
  return bVar1;
}

Assistant:

bool cmCTestVC::RunUpdateCommand(char const* const* cmd, OutputParser* out,
                                 OutputParser* err, Encoding encoding)
{
  // Report the command line.
  this->UpdateCommandLine = this->ComputeCommandLine(cmd);
  if (this->CTest->GetShowOnly()) {
    this->Log << this->UpdateCommandLine << "\n";
    return true;
  }

  // Run the command.
  return this->RunChild(cmd, out, err, nullptr, encoding);
}